

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TStdExtension.cpp
# Opt level: O2

void __thiscall StdOutbound_Test1_Test::TestBody(StdOutbound_Test1_Test *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper AStack_668;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_660;
  AssertionResult gtest_ar_;
  string s;
  char *outFileName;
  ifstream ifs2;
  undefined7 uStack_61f;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618 [64];
  ofstream ofs;
  byte abStack_3f8 [480];
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,"../test/testdata/StdExtension.data",_S_in);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::operator<<(&s,&ifs);
  testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
            ((internal *)&ifs2,"\"key1 = val1\\n##this is comment\\nkey2=val2\\n\"","s",
             (char (*) [41])"key1 = val1\n##this is comment\nkey2=val2\n",&s);
  if (ifs2 == (ifstream)0x0) {
    testing::Message::Message((Message *)&ofs);
    if (local_618[0]._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_618[0]._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
               ,0xc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&ofs);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (_ofs != (long *)0x0) {
      (**(code **)(*_ofs + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(local_618);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(local_618);
    outFileName = "stdoutbuond.test.tmp";
    std::ofstream::ofstream(&ofs,"stdoutbuond.test.tmp",_S_out);
    std::__cxx11::string::assign((char *)&s);
    std::operator<<(&ofs,&s);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = (abStack_3f8[_ofs[-3]] & 5) == 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::ofstream::close();
      std::ifstream::ifstream(&ifs2,"stdoutbuond.test.tmp",_S_in);
      std::operator<<(&s,&ifs2);
      testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                ((internal *)&gtest_ar_,"outFileName","s",&outFileName,&s);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_660);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_668,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                   ,0x17,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_668,(Message *)&local_660);
        testing::internal::AssertHelper::~AssertHelper(&AStack_668);
        if (local_660._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_660._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::ifstream::~ifstream(&ifs2);
    }
    else {
      testing::Message::Message((Message *)&local_660);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ifs2,(internal *)&gtest_ar_,(AssertionResult *)"!!ofs","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_668,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                 ,0x12,(char *)CONCAT71(uStack_61f,ifs2));
      testing::internal::AssertHelper::operator=(&AStack_668,(Message *)&local_660);
      testing::internal::AssertHelper::~AssertHelper(&AStack_668);
      std::__cxx11::string::~string((string *)&ifs2);
      if (local_660._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_660._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    std::ofstream::~ofstream(&ofs);
  }
  std::__cxx11::string::~string((string *)&s);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

TEST(StdOutbound, Test1) {
  ifstream ifs("../test/testdata/StdExtension.data");
  string s;
  s << ifs;
  ASSERT_EQ("key1 = val1\n##this is comment\nkey2=val2\n", s);

  const char * outFileName = "stdoutbuond.test.tmp";
  ofstream ofs(outFileName);
  s = outFileName;
  ofs << s;
  ASSERT_TRUE(!!ofs);
  ofs.close();

  ifstream ifs2(outFileName);
  s << ifs2;
  ASSERT_EQ(outFileName, s);
}